

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dio.cpp
# Opt level: O1

int anon_unknown.dwarf_a0be::ZeroCrossingEngine
              (double *filtered_signal,int y_length,double fs,double *interval_locations,
              double *intervals)

{
  double dVar1;
  double dVar2;
  int iVar3;
  void *pvVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined4 uVar11;
  long lVar12;
  bool bVar13;
  
  uVar7 = 0xffffffffffffffff;
  if (-1 < y_length) {
    uVar7 = (long)y_length * 4;
  }
  pvVar4 = operator_new__(uVar7);
  if (1 < y_length) {
    uVar8 = 1;
    do {
      uVar11 = 0;
      if ((0.0 < filtered_signal[uVar8 - 1]) && (filtered_signal[uVar8] <= 0.0)) {
        uVar11 = (undefined4)uVar8;
      }
      *(undefined4 *)((long)pvVar4 + uVar8 * 4 + -4) = uVar11;
      bVar13 = uVar8 != y_length - 1U;
      uVar8 = uVar8 + 1;
    } while (bVar13);
  }
  *(undefined4 *)((long)pvVar4 + (long)(int)(y_length - 1U) * 4) = 0;
  pvVar5 = operator_new__(uVar7);
  uVar10 = 0;
  uVar9 = 0;
  if (0 < y_length) {
    uVar7 = 0;
    uVar9 = 0;
    do {
      iVar3 = *(int *)((long)pvVar4 + uVar7 * 4);
      if (0 < iVar3) {
        lVar12 = (long)(int)uVar9;
        uVar9 = uVar9 + 1;
        *(int *)((long)pvVar5 + lVar12 * 4) = iVar3;
      }
      uVar7 = uVar7 + 1;
    } while ((uint)y_length != uVar7);
  }
  if (1 < (int)uVar9) {
    pvVar6 = operator_new__((ulong)uVar9 * 8);
    uVar7 = 0;
    do {
      iVar3 = *(int *)((long)pvVar5 + uVar7 * 4);
      *(double *)((long)pvVar6 + uVar7 * 8) =
           (double)iVar3 -
           filtered_signal[(long)iVar3 + -1] /
           (filtered_signal[iVar3] - filtered_signal[(long)iVar3 + -1]);
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
    uVar10 = uVar9 - 1;
    uVar7 = 0;
    do {
      dVar1 = *(double *)((long)pvVar6 + uVar7 * 8);
      dVar2 = *(double *)((long)pvVar6 + uVar7 * 8 + 8);
      intervals[uVar7] = fs / (dVar2 - dVar1);
      interval_locations[uVar7] = ((dVar2 + dVar1) * 0.5) / fs;
      uVar7 = uVar7 + 1;
    } while (uVar10 != uVar7);
    operator_delete__(pvVar6);
  }
  operator_delete__(pvVar5);
  operator_delete__(pvVar4);
  return uVar10;
}

Assistant:

static int ZeroCrossingEngine(const double *filtered_signal, int y_length,
    double fs, double *interval_locations, double *intervals) {
  int *negative_going_points = new int[y_length];

  for (int i = 0; i < y_length - 1; ++i)
    negative_going_points[i] =
      0.0 < filtered_signal[i] && filtered_signal[i + 1] <= 0.0 ? i + 1 : 0;
  negative_going_points[y_length - 1] = 0;

  int *edges = new int[y_length];
  int count = 0;
  for (int i = 0; i < y_length; ++i)
    if (negative_going_points[i] > 0)
      edges[count++] = negative_going_points[i];

  if (count < 2) {
    delete[] edges;
    delete[] negative_going_points;
    return 0;
  }

  double *fine_edges = new double[count];
  for (int i = 0; i < count; ++i)
    fine_edges[i] =
      edges[i] - filtered_signal[edges[i] - 1] /
      (filtered_signal[edges[i]] - filtered_signal[edges[i] - 1]);

  for (int i = 0; i < count - 1; ++i) {
    intervals[i] = fs / (fine_edges[i + 1] - fine_edges[i]);
    interval_locations[i] = (fine_edges[i] + fine_edges[i + 1]) / 2.0 / fs;
  }

  delete[] fine_edges;
  delete[] edges;
  delete[] negative_going_points;
  return count - 1;
}